

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICMakeFiles.cxx
# Opt level: O0

Value * __thiscall
anon_unknown.dwarf_628eb3::CMakeFiles::DumpInput
          (Value *__return_storage_ptr__,CMakeFiles *this,string *file)

{
  bool bVar1;
  Value *pVVar2;
  Value local_118;
  string local_f0;
  undefined1 local_d0 [8];
  string path;
  Value local_88;
  Value local_60;
  byte local_22;
  byte local_21;
  bool isCMake;
  string *psStack_20;
  string *file_local;
  CMakeFiles *this_local;
  Value *input;
  
  local_21 = 0;
  psStack_20 = file;
  file_local = (string *)this;
  this_local = (CMakeFiles *)__return_storage_ptr__;
  Json::Value::Value(__return_storage_ptr__,objectValue);
  local_22 = cmsys::SystemTools::IsSubDirectory(psStack_20,&this->CMakeModules);
  if ((bool)local_22) {
    Json::Value::Value(&local_60,true);
    pVVar2 = Json::Value::operator[](__return_storage_ptr__,"isCMake");
    Json::Value::operator=(pVVar2,&local_60);
    Json::Value::~Value(&local_60);
  }
  bVar1 = cmsys::SystemTools::IsSubDirectory(psStack_20,this->TopSource);
  if ((!bVar1) && (bVar1 = cmsys::SystemTools::IsSubDirectory(psStack_20,this->TopBuild), !bVar1)) {
    Json::Value::Value(&local_88,true);
    pVVar2 = Json::Value::operator[](__return_storage_ptr__,"isExternal");
    Json::Value::operator=(pVVar2,&local_88);
    Json::Value::~Value(&local_88);
  }
  if (((this->OutOfSource & 1U) != 0) &&
     (bVar1 = cmsys::SystemTools::IsSubDirectory(psStack_20,this->TopBuild), bVar1)) {
    Json::Value::Value((Value *)((long)&path.field_2 + 8),true);
    pVVar2 = Json::Value::operator[](__return_storage_ptr__,"isGenerated");
    Json::Value::operator=(pVVar2,(Value *)((long)&path.field_2 + 8));
    Json::Value::~Value((Value *)((long)&path.field_2 + 8));
  }
  std::__cxx11::string::string((string *)local_d0,(string *)psStack_20);
  if (((local_22 & 1) == 0) &&
     (bVar1 = cmsys::SystemTools::IsSubDirectory((string *)local_d0,this->TopSource), bVar1)) {
    cmSystemTools::RelativePath(&local_f0,this->TopSource,(string *)local_d0);
    std::__cxx11::string::operator=((string *)local_d0,(string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_f0);
  }
  Json::Value::Value(&local_118,(string *)local_d0);
  pVVar2 = Json::Value::operator[](__return_storage_ptr__,"path");
  Json::Value::operator=(pVVar2,&local_118);
  Json::Value::~Value(&local_118);
  local_21 = 1;
  std::__cxx11::string::~string((string *)local_d0);
  if ((local_21 & 1) == 0) {
    Json::Value::~Value(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Json::Value CMakeFiles::DumpInput(std::string const& file)
{
  Json::Value input = Json::objectValue;

  bool const isCMake = cmSystemTools::IsSubDirectory(file, this->CMakeModules);
  if (isCMake) {
    input["isCMake"] = true;
  }

  if (!cmSystemTools::IsSubDirectory(file, this->TopSource) &&
      !cmSystemTools::IsSubDirectory(file, this->TopBuild)) {
    input["isExternal"] = true;
  }

  if (this->OutOfSource &&
      cmSystemTools::IsSubDirectory(file, this->TopBuild)) {
    input["isGenerated"] = true;
  }

  std::string path = file;
  if (!isCMake && cmSystemTools::IsSubDirectory(path, this->TopSource)) {
    // Use a relative path within the source directory.
    path = cmSystemTools::RelativePath(this->TopSource, path);
  }
  input["path"] = path;

  return input;
}